

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_vehicle.c
# Opt level: O3

void control_loop(void)

{
  int iVar1;
  OdometryPtr odm;
  SpurUserParamsPtr spur;
  long lVar2;
  OdometryPtr p_Var3;
  __pthread_unwind_buf_t *data;
  double *pdVar4;
  byte bVar5;
  double dVar6;
  double dVar7;
  timespec current;
  __pthread_unwind_buf_t __cancel_buf;
  double adStack_378 [78];
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  timespec local_e8;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  timespec local_a8;
  __pthread_unwind_buf_t local_98;
  
  bVar5 = 0;
  odm = get_odometry_ptr();
  spur = get_spur_user_param_ptr();
  yprintf(OUTPUT_LV_INFO,"Trajectory control loop started.\n");
  data = &local_98;
  iVar1 = __sigsetjmp(data,0);
  if (iVar1 != 0) {
    control_loop_cleanup(data);
    __pthread_unwind_next(&local_98);
  }
  __pthread_register_cancel(&local_98);
  local_d0 = get_time();
  iVar1 = clock_gettime(1,&local_e8);
  if (iVar1 == -1) {
    yprintf(OUTPUT_LV_ERROR,"Error on clock_gettime\n");
    pthread_exit(&control_loop::status);
  }
  local_b0 = (double)local_e8.tv_nsec / 1000000000.0 + (double)local_e8.tv_sec;
  local_f8 = local_d0;
  do {
    dVar6 = p(YP_PARAM_CONTROL_CYCLE,MOTOR_RIGHT);
    local_e8.tv_nsec = (long)(dVar6 * 1000000000.0 + (double)local_e8.tv_nsec);
    local_e8.tv_sec = local_e8.tv_sec + local_e8.tv_nsec / 1000000000;
    local_e8.tv_nsec = local_e8.tv_nsec % 1000000000;
    clock_nanosleep(1,1,&local_e8,(timespec *)0x0);
    iVar1 = clock_gettime(1,&local_a8);
    if (iVar1 == -1) {
      yprintf(OUTPUT_LV_ERROR,"Error on clock_gettime\n");
      pthread_exit(&control_loop::status_1);
    }
    local_f0 = (double)local_a8.tv_nsec / 1000000000.0 + (double)local_a8.tv_sec;
    iVar1 = option(OPTION_EXIT_ON_TIME_JUMP);
    dVar6 = local_f8;
    if (iVar1 != 0) {
      local_100 = local_f0 - local_b0;
      dVar6 = get_time();
      dVar7 = dVar6 - local_f8;
      if (dVar7 < 0.0) {
        yprintf(OUTPUT_LV_ERROR,
                "Detected system time jump back, monotonic time diff: %0.5fs, system time diff: %0.5fs\n"
                ,local_100);
        pthread_exit(&control_loop::status_2);
      }
      local_108 = dVar7 - local_100;
      local_c8 = dVar6;
      local_b8 = dVar7;
      dVar6 = p(YP_PARAM_MAX_TIME_JUMP_NEG,MOTOR_RIGHT);
      if (local_108 < -dVar6) {
LAB_00109cd3:
        yprintf(OUTPUT_LV_ERROR,
                "Detected system time jump: %0.5fs, monotonic time diff: %0.5fs, system time diff: %0.5fs\n"
                ,local_108,local_100,local_b8);
        pthread_exit(&control_loop::status_3);
      }
      local_d8 = local_c8;
      dVar7 = p(YP_PARAM_MAX_TIME_JUMP,MOTOR_RIGHT);
      dVar6 = local_d8;
      if (dVar7 < local_108) goto LAB_00109cd3;
    }
    local_c0 = dVar6;
    coordinate_synchronize(odm,spur);
    p_Var3 = odm;
    pdVar4 = adStack_378;
    for (lVar2 = 0x4e; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pdVar4 = p_Var3->x;
      p_Var3 = (OdometryPtr)((long)p_Var3 + (ulong)bVar5 * -0x10 + 8);
      pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
    }
    run_control(spur);
    iVar1 = option(OPTION_WITHOUT_DEVICE);
    if (iVar1 != 0) {
      simulate_control(odm,spur);
    }
    pthread_testcancel();
    local_b0 = local_f0;
    local_f8 = local_c0;
  } while( true );
}

Assistant:

void control_loop(void)
{
  OdometryPtr odometry;
  SpurUserParamsPtr spur;

  odometry = get_odometry_ptr();
  spur = get_spur_user_param_ptr();

  yprintf(OUTPUT_LV_INFO, "Trajectory control loop started.\n");
  pthread_cleanup_push(control_loop_cleanup, NULL);

  double last_time = get_time();

#if defined(HAVE_CLOCK_NANOSLEEP)  // clock_nanosleepが利用可能
  struct timespec request;

  if (clock_gettime(CLOCK_MONOTONIC, &request) == -1)
  {
    yprintf(OUTPUT_LV_ERROR, "Error on clock_gettime\n");
    static int status = EXIT_FAILURE;
    pthread_exit(&status);
  }
  double last_monotonic_time = request.tv_sec + request.tv_nsec / 1000000000.0;
#endif  // defined(HAVE_CLOCK_NANOSLEEP)
  while (1)
  {
    const double control_cycle = p(YP_PARAM_CONTROL_CYCLE, 0);

#if defined(HAVE_CLOCK_NANOSLEEP)  // clock_nanosleepが利用可能
    request.tv_nsec += control_cycle * 1000000000;
    request.tv_sec += request.tv_nsec / 1000000000;
    request.tv_nsec = request.tv_nsec % 1000000000;

    clock_nanosleep(CLOCK_MONOTONIC, TIMER_ABSTIME, &request, 0);

    struct timespec current;
    if (clock_gettime(CLOCK_MONOTONIC, &current) == -1)
    {
      yprintf(OUTPUT_LV_ERROR, "Error on clock_gettime\n");
      static int status = EXIT_FAILURE;
      pthread_exit(&status);
    }
    const double current_monotonic_time = current.tv_sec + current.tv_nsec / 1000000000.0;
    const double expected_dt = current_monotonic_time - last_monotonic_time;
    last_monotonic_time = current_monotonic_time;
#else
    yp_usleep(control_cycle * 1000000);

    const double expected_dt = control_cycle;
#endif  // defined(HAVE_CLOCK_NANOSLEEP)

    if ((option(OPTION_EXIT_ON_TIME_JUMP)))
    {
      const double now = get_time();
      const double dt = now - last_time;
      const double dt_error = dt - expected_dt;
      last_time = now;
      if (dt < 0)
      {
        yprintf(
            OUTPUT_LV_ERROR,
            "Detected system time jump back, monotonic time diff: %0.5fs, system time diff: %0.5fs\n",
            expected_dt, dt);
        static int status = EXIT_FAILURE;
        pthread_exit(&status);
      }
      if (dt_error < -p(YP_PARAM_MAX_TIME_JUMP_NEG, 0) || p(YP_PARAM_MAX_TIME_JUMP, 0) < dt_error)
      {
        yprintf(
            OUTPUT_LV_ERROR,
            "Detected system time jump: %0.5fs, monotonic time diff: %0.5fs, system time diff: %0.5fs\n",
            dt_error, expected_dt, dt);
        static int status = EXIT_FAILURE;
        pthread_exit(&status);
      }
    }

    coordinate_synchronize(odometry, spur);
    run_control(*odometry, spur);

    if ((option(OPTION_WITHOUT_DEVICE)))
    {
      simulate_control(odometry, spur);
    }

    // スレッドの停止要求チェック
    pthread_testcancel();
  }
  pthread_cleanup_pop(1);
}